

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::copy_application_info
          (Impl *this,VkApplicationInfo *app_info,ScratchAllocator *alloc,
          VkApplicationInfo **out_app_info)

{
  VkApplicationInfo *pVVar1;
  size_t sVar2;
  char *pcVar3;
  VkApplicationInfo *app;
  VkApplicationInfo **out_app_info_local;
  ScratchAllocator *alloc_local;
  VkApplicationInfo *app_info_local;
  Impl *this_local;
  
  pVVar1 = copy<VkApplicationInfo>(this,app_info,1,alloc);
  if (pVVar1->pEngineName != (char *)0x0) {
    pcVar3 = pVVar1->pEngineName;
    sVar2 = strlen(pVVar1->pEngineName);
    pcVar3 = copy<char>(this,pcVar3,sVar2 + 1,alloc);
    pVVar1->pEngineName = pcVar3;
  }
  if (pVVar1->pApplicationName != (char *)0x0) {
    pcVar3 = pVVar1->pApplicationName;
    sVar2 = strlen(pVVar1->pApplicationName);
    pcVar3 = copy<char>(this,pcVar3,sVar2 + 1,alloc);
    pVVar1->pApplicationName = pcVar3;
  }
  *out_app_info = pVVar1;
  return true;
}

Assistant:

bool StateRecorder::Impl::copy_application_info(const VkApplicationInfo *app_info, ScratchAllocator &alloc,
                                                VkApplicationInfo **out_app_info)
{
	auto *app = copy(app_info, 1, alloc);
	if (app->pEngineName)
		app->pEngineName = copy(app->pEngineName, strlen(app->pEngineName) + 1, alloc);
	if (app->pApplicationName)
		app->pApplicationName = copy(app->pApplicationName, strlen(app->pApplicationName) + 1, alloc);

	*out_app_info = app;
	return true;
}